

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.h
# Opt level: O0

void __thiscall Controller::CallAction(Controller *this)

{
  NewChangeBuilder *this_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  reference pvVar4;
  Tools *pTVar5;
  NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *newChangeBase;
  NewChangeForFile *this_01;
  allocator<char> local_131;
  string local_130;
  NewCommit local_110;
  NewCommit newCommit;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  NewChangeBuilder *local_98;
  NewChangeBuilder *newChange;
  string local_88;
  undefined1 local_68 [8];
  Initialize init;
  allocator<char> local_31;
  string local_30 [32];
  Controller *local_10;
  Controller *this_local;
  
  local_10 = this;
  pcVar3 = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,pcVar3,&local_31);
  uVar2 = (**(this->
             super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._vptr_ControllerBase)(this,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if ((uVar2 & 1) != 0) {
    pcVar3 = (char *)std::__cxx11::string::data();
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((this->
                  super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._operations,0);
    bVar1 = std::operator==(pcVar3,pvVar4);
    if (bVar1) {
      Initialize::Initialize((Initialize *)local_68);
      Initialize::~Initialize((Initialize *)local_68);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::data();
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((this->
                    super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._operations,1);
      bVar1 = std::operator==(pcVar3,pvVar4);
      if (bVar1) {
        pTVar5 = Tools::getInstance();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,".stn",(allocator<char> *)((long)&newChange + 7));
        bVar1 = Tools::SearchFileFromDir(pTVar5,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&newChange + 7));
        if (bVar1) {
          local_98 = (NewChangeBuilder *)operator_new(1);
          pTVar5 = Tools::getInstance();
          pcVar3 = (char *)std::__cxx11::string::data();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar3,&local_d9);
          Tools::CheckLine(&local_b8,pTVar5,&local_d8);
          bVar1 = std::operator==(&local_b8,"dot");
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          this_00 = local_98;
          if (bVar1) {
            newChangeBase =
                 (NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)operator_new(0x58);
            NewChangeDot::NewChangeDot((NewChangeDot *)newChangeBase);
            NewChangeBuilder::
            Build<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (this_00,newChangeBase);
          }
          else {
            this_01 = (NewChangeForFile *)operator_new(0x78);
            newCommit.path._6_1_ = 1;
            pcVar3 = (char *)std::__cxx11::string::data();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,pcVar3,(allocator<char> *)((long)&newCommit.path + 7));
            NewChangeForFile::NewChangeForFile(this_01,&local_100);
            newCommit.path._6_1_ = 0;
            NewChangeBuilder::
            Build<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (this_00,(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)this_01);
            std::__cxx11::string::~string((string *)&local_100);
            std::allocator<char>::~allocator((allocator<char> *)((long)&newCommit.path + 7));
          }
        }
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::data();
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((this->
                      super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._operations,2);
        bVar1 = std::operator==(pcVar3,pvVar4);
        if (bVar1) {
          pcVar3 = (char *)std::__cxx11::string::data();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar3,&local_131)
          ;
          NewCommit::NewCommit(&local_110,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void CallAction() override {
        if (this->FindOperation(this->_command->data())) {
            if (this->_command->data() == this->_operations->at(0)) {
                Initialize init;
            } else if (this->_command->data() == this->_operations->at(1)) {
                if (Tools::getInstance()->SearchFileFromDir(".stn")) {
                    NewChangeBuilder *newChange = new NewChangeBuilder();
                    if (Tools::getInstance()->CheckLine(this->_arg->data()) == "dot") {
                        newChange->Build(new NewChangeDot());
                    } else {
                        newChange->Build(new NewChangeForFile(this->_arg->data()));
                    }
                }
            } else if (this->_command->data() == this->_operations->at(2)) {
                NewCommit newCommit(this->_arg->data());
            }
        }
    }